

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectGlow.cpp
# Opt level: O1

SharedPtr<FontEffect> __thiscall
Rml::FontEffectGlowInstancer::InstanceFontEffect
          (FontEffectGlowInstancer *this,String *param_1,PropertyDictionary *properties)

{
  Colour<unsigned_char,_255,_false> _width_blur;
  Colour<unsigned_char,_255,_false> _width_outline;
  Colourb _colour;
  FontEffectGlow *pFVar1;
  FontEffectGlowInstancer *pFVar2;
  bool bVar3;
  Property *pPVar4;
  PropertyDictionary *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  SharedPtr<FontEffect> SVar6;
  SharedPtr<Rml::FontEffectGlow> font_effect;
  undefined1 local_51;
  undefined8 local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  FontEffectGlowInstancer *local_40;
  ulong local_38;
  
  local_40 = this;
  pPVar4 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[0]);
  local_50._0_1_ = '\0';
  local_50._1_1_ = '\0';
  local_50._2_1_ = '\0';
  local_50._3_1_ = '\0';
  Variant::GetInto<int,_0>(&pPVar4->value,(int *)&local_50);
  _width_outline = local_50._0_4_;
  pPVar4 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[1]);
  local_50._0_1_ = '\0';
  local_50._1_1_ = '\0';
  local_50._2_1_ = '\0';
  local_50._3_1_ = '\0';
  Variant::GetInto<int,_0>(&pPVar4->value,(int *)&local_50);
  _width_blur = local_50._0_4_;
  pPVar4 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[2]);
  local_50 = (FontEffectGlow *)((ulong)local_50._4_4_ << 0x20);
  Variant::GetInto<int,_0>(&pPVar4->value,(int *)&local_50);
  local_38 = (ulong)local_50 & 0xffffffff;
  pPVar4 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[3]);
  local_50 = (FontEffectGlow *)((ulong)local_50 & 0xffffffff00000000);
  Variant::GetInto<int,_0>(&pPVar4->value,(int *)&local_50);
  pFVar1 = local_50;
  pPVar4 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[4]);
  local_50 = (FontEffectGlow *)CONCAT44(local_50._4_4_,0xff000000);
  Variant::GetInto<Rml::Colour<unsigned_char,_255,_false>,_0>
            (&pPVar4->value,(Colour<unsigned_char,_255,_false> *)&local_50);
  _colour = local_50._0_4_;
  if ((int)_width_blur < 0) {
    _width_blur = _width_outline;
  }
  local_50 = (FontEffectGlow *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Rml::FontEffectGlow,std::allocator<Rml::FontEffectGlow>>
            (&local_48,(FontEffectGlow **)&local_50,(allocator<Rml::FontEffectGlow> *)&local_51);
  bVar3 = FontEffectGlow::Initialise
                    (local_50,(int)_width_outline,(int)_width_blur,
                     (Vector2i)(((long)pFVar1 << 0x20) + local_38));
  if (bVar3) {
    FontEffect::SetColour(&local_50->super_FontEffect,_colour);
    _Var5._M_pi = local_48._M_pi;
    (local_40->super_FontEffectInstancer)._vptr_FontEffectInstancer = (_func_int **)local_50;
    (local_40->super_FontEffectInstancer).properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (local_40->super_FontEffectInstancer).properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var5._M_pi;
    local_50 = (FontEffectGlow *)0x0;
    _Var5._M_pi = extraout_RDX_00;
  }
  else {
    (local_40->super_FontEffectInstancer)._vptr_FontEffectInstancer = (_func_int **)0x0;
    (local_40->super_FontEffectInstancer).properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Var5._M_pi = extraout_RDX;
  }
  pFVar2 = local_40;
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
    _Var5._M_pi = extraout_RDX_01;
  }
  SVar6.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  SVar6.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pFVar2;
  return (SharedPtr<FontEffect>)
         SVar6.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<FontEffect> FontEffectGlowInstancer::InstanceFontEffect(const String& /*name*/, const PropertyDictionary& properties)
{
	Vector2i offset;
	int width_outline = properties.GetProperty(id_width_outline)->Get<int>();
	int width_blur = properties.GetProperty(id_width_blur)->Get<int>();
	offset.x = properties.GetProperty(id_offset_x)->Get<int>();
	offset.y = properties.GetProperty(id_offset_y)->Get<int>();
	Colourb color = properties.GetProperty(id_color)->Get<Colourb>();

	if (width_blur < 0)
		width_blur = width_outline;

	auto font_effect = MakeShared<FontEffectGlow>();
	if (font_effect->Initialise(width_outline, width_blur, offset))
	{
		font_effect->SetColour(color);
		return font_effect;
	}

	return nullptr;
}